

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void applyNumericAffinity(Mem *pRec,int bTryForInt)

{
  u8 enc;
  char *z;
  int iVar1;
  int iVar2;
  i64 iValue;
  double rValue;
  MemValue local_38;
  MemValue local_30;
  
  z = pRec->z;
  iVar2 = pRec->n;
  enc = pRec->enc;
  iVar1 = sqlite3AtoF(z,&local_30.r,iVar2,enc);
  if (iVar1 != 0) {
    iVar2 = sqlite3Atoi64(z,&local_38.i,iVar2,enc);
    if (iVar2 == 0) {
      pRec->u = local_38;
      *(byte *)&pRec->flags = (byte)pRec->flags | 4;
    }
    else {
      pRec->u = local_30;
      *(byte *)&pRec->flags = (byte)pRec->flags | 8;
      if (bTryForInt != 0) {
        sqlite3VdbeIntegerAffinity(pRec);
      }
    }
    *(byte *)&pRec->flags = (byte)pRec->flags & 0xfd;
  }
  return;
}

Assistant:

static void applyNumericAffinity(Mem *pRec, int bTryForInt){
  double rValue;
  i64 iValue;
  u8 enc = pRec->enc;
  assert( (pRec->flags & (MEM_Str|MEM_Int|MEM_Real))==MEM_Str );
  if( sqlite3AtoF(pRec->z, &rValue, pRec->n, enc)==0 ) return;
  if( 0==sqlite3Atoi64(pRec->z, &iValue, pRec->n, enc) ){
    pRec->u.i = iValue;
    pRec->flags |= MEM_Int;
  }else{
    pRec->u.r = rValue;
    pRec->flags |= MEM_Real;
    if( bTryForInt ) sqlite3VdbeIntegerAffinity(pRec);
  }
  /* TEXT->NUMERIC is many->one.  Hence, it is important to invalidate the
  ** string representation after computing a numeric equivalent, because the
  ** string representation might not be the canonical representation for the
  ** numeric value.  Ticket [343634942dd54ab57b7024] 2018-01-31. */
  pRec->flags &= ~MEM_Str;
}